

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_append_tag_directive
              (yaml_emitter_t *emitter,yaml_tag_directive_t value,int allow_duplicates)

{
  yaml_tag_directive_t *pyVar1;
  int iVar2;
  yaml_char_t *local_48;
  yaml_tag_directive_t copy;
  yaml_tag_directive_t *tag_directive;
  int allow_duplicates_local;
  yaml_emitter_t *emitter_local;
  yaml_tag_directive_t value_local;
  
  memset(&local_48,0,0x10);
  for (copy.prefix = (yaml_char_t *)(emitter->tag_directives).start;
      (yaml_tag_directive_t *)copy.prefix != (emitter->tag_directives).top;
      copy.prefix = copy.prefix + 0x10) {
    iVar2 = strcmp((char *)value.handle,*(char **)copy.prefix);
    if (iVar2 == 0) {
      if (allow_duplicates != 0) {
        return 1;
      }
      iVar2 = yaml_emitter_set_emitter_error(emitter,"duplicate %TAG directive");
      return iVar2;
    }
  }
  local_48 = yaml_strdup(value.handle);
  copy.handle = yaml_strdup(value.prefix);
  if ((local_48 == (yaml_char_t *)0x0) || (copy.handle == (yaml_char_t *)0x0)) {
    emitter->error = YAML_MEMORY_ERROR;
  }
  else {
    if (((emitter->tag_directives).top != (emitter->tag_directives).end) ||
       (iVar2 = yaml_stack_extend(&(emitter->tag_directives).start,&(emitter->tag_directives).top,
                                  &(emitter->tag_directives).end), iVar2 != 0)) {
      pyVar1 = (emitter->tag_directives).top;
      (emitter->tag_directives).top = pyVar1 + 1;
      pyVar1->handle = local_48;
      pyVar1->prefix = copy.handle;
      return 1;
    }
    emitter->error = YAML_MEMORY_ERROR;
  }
  yaml_free(local_48);
  yaml_free(copy.handle);
  return 0;
}

Assistant:

static int
yaml_emitter_append_tag_directive(yaml_emitter_t *emitter,
        yaml_tag_directive_t value, int allow_duplicates)
{
    yaml_tag_directive_t *tag_directive;
    yaml_tag_directive_t copy = { NULL, NULL };

    for (tag_directive = emitter->tag_directives.start;
            tag_directive != emitter->tag_directives.top; tag_directive ++) {
        if (strcmp((char *)value.handle, (char *)tag_directive->handle) == 0) {
            if (allow_duplicates)
                return 1;
            return yaml_emitter_set_emitter_error(emitter,
                    "duplicate %TAG directive");
        }
    }

    copy.handle = yaml_strdup(value.handle);
    copy.prefix = yaml_strdup(value.prefix);
    if (!copy.handle || !copy.prefix) {
        emitter->error = YAML_MEMORY_ERROR;
        goto error;
    }

    if (!PUSH(emitter, emitter->tag_directives, copy))
        goto error;

    return 1;

error:
    yaml_free(copy.handle);
    yaml_free(copy.prefix);
    return 0;
}